

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::setupDefaultInputs
          (TriangleDerivateCaseInstance *this)

{
  float fVar1;
  float fVar2;
  float local_98;
  float local_94;
  float coords [16];
  float positions [16];
  int numVertices;
  TriangleDerivateCaseInstance *this_local;
  
  memcpy(coords + 0xe,&DAT_0130eae0,0x40);
  local_98 = tcu::Vector<float,_4>::x(&this->m_values->coordMin);
  local_94 = tcu::Vector<float,_4>::y(&this->m_values->coordMin);
  coords[0] = tcu::Vector<float,_4>::z(&this->m_values->coordMin);
  coords[1] = tcu::Vector<float,_4>::w(&this->m_values->coordMax);
  coords[2] = tcu::Vector<float,_4>::x(&this->m_values->coordMin);
  coords[3] = tcu::Vector<float,_4>::y(&this->m_values->coordMax);
  fVar1 = tcu::Vector<float,_4>::z(&this->m_values->coordMin);
  fVar2 = tcu::Vector<float,_4>::z(&this->m_values->coordMax);
  coords[4] = (fVar1 + fVar2) * 0.5;
  fVar1 = tcu::Vector<float,_4>::w(&this->m_values->coordMin);
  fVar2 = tcu::Vector<float,_4>::w(&this->m_values->coordMax);
  coords[5] = (fVar1 + fVar2) * 0.5;
  coords[6] = tcu::Vector<float,_4>::x(&this->m_values->coordMax);
  coords[7] = tcu::Vector<float,_4>::y(&this->m_values->coordMin);
  fVar1 = tcu::Vector<float,_4>::z(&this->m_values->coordMin);
  fVar2 = tcu::Vector<float,_4>::z(&this->m_values->coordMax);
  coords[8] = (fVar1 + fVar2) * 0.5;
  fVar1 = tcu::Vector<float,_4>::w(&this->m_values->coordMin);
  fVar2 = tcu::Vector<float,_4>::w(&this->m_values->coordMax);
  coords[9] = (fVar1 + fVar2) * 0.5;
  coords[10] = tcu::Vector<float,_4>::x(&this->m_values->coordMax);
  coords[0xb] = tcu::Vector<float,_4>::y(&this->m_values->coordMax);
  coords[0xc] = tcu::Vector<float,_4>::z(&this->m_values->coordMax);
  coords[0xd] = tcu::Vector<float,_4>::w(&this->m_values->coordMin);
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,
             coords + 0xe);
  if (this->m_definitions->coordDataType != TYPE_LAST) {
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,
               &local_98);
  }
  return;
}

Assistant:

void TriangleDerivateCaseInstance::setupDefaultInputs (void)
{
	const int		numVertices			= 4;
	const float		positions[]			=
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		1.0f, -1.0f, 0.0f, 1.0f,
		1.0f,  1.0f, 0.0f, 1.0f
	};
	const float		coords[]			=
	{
		m_values.coordMin.x(), m_values.coordMin.y(), m_values.coordMin.z(),								m_values.coordMax.w(),
		m_values.coordMin.x(), m_values.coordMax.y(), (m_values.coordMin.z()+m_values.coordMax.z())*0.5f,	(m_values.coordMin.w()+m_values.coordMax.w())*0.5f,
		m_values.coordMax.x(), m_values.coordMin.y(), (m_values.coordMin.z()+m_values.coordMax.z())*0.5f,	(m_values.coordMin.w()+m_values.coordMax.w())*0.5f,
		m_values.coordMax.x(), m_values.coordMax.y(), m_values.coordMax.z(),								m_values.coordMin.w()
	};

	addAttribute(0u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, positions);
	if (m_definitions.coordDataType != glu::TYPE_LAST)
		addAttribute(1u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, coords);
}